

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions_detail.hpp
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
chaiscript::dispatch::detail::
call_func<std::__cxx11::string(*)(chaiscript::Boxed_Value_const&),std::__cxx11::string,chaiscript::Boxed_Value_const&,0ul>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,detail *this,Function_Params *param_1,Function_Params *param_4,
          Type_Conversions_State *param_5)

{
  Boxed_Value *pBVar1;
  Boxed_Value *bv;
  Boxed_Value BVar2;
  Boxed_Value local_48;
  Type_Conversions_State *local_38;
  Type_Conversions_State *t_conversions_local;
  Function_Params *params_local;
  _func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_Boxed_Value_ptr **f_local;
  _func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_Boxed_Value_ptr
  *param_0_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10;
  
  pBVar1 = param_1->m_begin;
  local_38 = param_5;
  t_conversions_local = (Type_Conversions_State *)param_4;
  params_local = param_1;
  f_local = (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_Boxed_Value_ptr
             **)this;
  local_10 = __return_storage_ptr__;
  bv = Function_Params::operator[](param_4,0);
  BVar2 = boxed_cast<chaiscript::Boxed_Value_const&>((chaiscript *)&local_48,bv,local_38);
  (*(code *)pBVar1)(__return_storage_ptr__,(chaiscript *)&local_48,
                    BVar2.m_data.
                    super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi);
  Boxed_Value::~Boxed_Value(&local_48);
  return __return_storage_ptr__;
}

Assistant:

Ret call_func(Ret (*)(Params...),
                    std::index_sequence<I...>,
                    const Callable &f,
                    [[maybe_unused]] const chaiscript::Function_Params &params,
                    [[maybe_unused]] const Type_Conversions_State &t_conversions) {
        return f(boxed_cast<Params>(params[I], &t_conversions)...);
      }